

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_import(lysp_ctx *ctx,lysp_stmt *stmt,lysp_import **imports)

{
  ly_stmt lVar1;
  LY_ERR LVar2;
  char *pcVar3;
  char *pcVar4;
  ly_ctx *local_98;
  ly_ctx *local_90;
  ly_ctx *local_80;
  ly_ctx *local_78;
  ly_ctx *local_70;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  LY_ERR ret___1;
  LY_ERR ret__;
  char *p__;
  char *str;
  lysp_import *imp;
  lysp_import **imports_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  p__ = (char *)0x0;
  imp = (lysp_import *)imports;
  imports_local = (lysp_import **)stmt;
  stmt_local = (lysp_stmt *)ctx;
  if (*imports == (lysp_import *)0x0) {
    _ret___1 = (undefined8 *)malloc(0x48);
    if (_ret___1 == (undefined8 *)0x0) {
      if (stmt_local == (lysp_stmt *)0x0) {
        local_78 = (ly_ctx *)0x0;
      }
      else {
        local_78 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(stmt_local[1].stmt + 8) +
                      (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
      }
      ly_log(local_78,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_import");
      return LY_EMEM;
    }
    *_ret___1 = 1;
  }
  else {
    *(long *)((*imports)[-1].rev + 6) = *(long *)((*imports)[-1].rev + 6) + 1;
    _ret___1 = (undefined8 *)
               realloc((*imports)[-1].rev + 6,*(long *)((*imports)[-1].rev + 6) * 0x40 + 8);
    if (_ret___1 == (undefined8 *)0x0) {
      *(long *)&imp->module[-1].implemented = *(long *)&imp->module[-1].implemented + -1;
      if (stmt_local == (lysp_stmt *)0x0) {
        local_70 = (ly_ctx *)0x0;
      }
      else {
        local_70 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(stmt_local[1].stmt + 8) +
                      (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
      }
      ly_log(local_70,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_import");
      return LY_EMEM;
    }
  }
  imp->module = (lys_module *)(_ret___1 + 1);
  str = (char *)((long)imp->module + (*(long *)&imp->module[-1].implemented + -1) * 0x40);
  memset(str,0,0x40);
  LVar2 = lysp_stmt_validate_value((lysp_ctx *)stmt_local,Y_IDENTIF_ARG,(char *)imports_local[1]);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if (stmt_local == (lysp_stmt *)0x0) {
    local_80 = (ly_ctx *)0x0;
  }
  else {
    local_80 = *(ly_ctx **)
                **(undefined8 **)
                  (*(long *)(stmt_local[1].stmt + 8) +
                  (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
  }
  LVar2 = lydict_insert(local_80,(char *)imports_local[1],0,(char **)(str + 8));
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  _ret___3 = imports_local[5];
  do {
    if (_ret___3 == (lysp_import *)0x0) {
      return LY_SUCCESS;
    }
    lVar1 = *(ly_stmt *)(_ret___3->rev + 2);
    if (lVar1 == LY_STMT_DESCRIPTION) {
      LVar2 = lysp_stmt_text_field
                        ((lysp_ctx *)stmt_local,(lysp_stmt *)_ret___3,0,(char **)(str + 0x18),
                         Y_STR_ARG,(lysp_ext_instance **)(str + 0x28));
joined_r0x001b4081:
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
    else {
      if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
        LVar2 = lysp_stmt_ext((lysp_ctx *)stmt_local,(lysp_stmt *)_ret___3,
                              *(ly_stmt *)((long)imports_local + 0x34),0,
                              (lysp_ext_instance **)(str + 0x28));
        goto joined_r0x001b4081;
      }
      if (lVar1 != LY_STMT_PREFIX) {
        if (lVar1 == LY_STMT_REFERENCE) {
          LVar2 = lysp_stmt_text_field
                            ((lysp_ctx *)stmt_local,(lysp_stmt *)_ret___3,0,(char **)(str + 0x20),
                             Y_STR_ARG,(lysp_ext_instance **)(str + 0x28));
        }
        else {
          if (lVar1 != LY_STMT_REVISION_DATE) {
            if (stmt_local == (lysp_stmt *)0x0) {
              local_98 = (ly_ctx *)0x0;
            }
            else {
              local_98 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)(stmt_local[1].stmt + 8) +
                            (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
            }
            pcVar3 = lyplg_ext_stmt2str(*(ly_stmt *)(_ret___3->rev + 2));
            pcVar4 = lyplg_ext_stmt2str(LY_STMT_IMPORT);
            ly_vlog(local_98,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,pcVar4);
            return LY_EVALID;
          }
          LVar2 = lysp_stmt_text_field
                            ((lysp_ctx *)stmt_local,(lysp_stmt *)imports_local,0,&p__,Y_STR_ARG,
                             (lysp_ext_instance **)(str + 0x28));
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          strcpy(str + 0x32,p__);
          if (stmt_local == (lysp_stmt *)0x0) {
            local_90 = (ly_ctx *)0x0;
          }
          else {
            local_90 = *(ly_ctx **)
                        **(undefined8 **)
                          (*(long *)(stmt_local[1].stmt + 8) +
                          (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
          }
          lydict_remove(local_90,p__);
          LVar2 = lysp_check_date((lysp_ctx *)stmt_local,str + 0x32,10,"revision-date");
        }
        goto joined_r0x001b4081;
      }
      LVar2 = lysp_stmt_text_field
                        ((lysp_ctx *)stmt_local,(lysp_stmt *)_ret___3,0,(char **)(str + 0x10),
                         Y_IDENTIF_ARG,(lysp_ext_instance **)(str + 0x28));
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      LVar2 = lysp_check_prefix((lysp_ctx *)stmt_local,(lysp_import *)imp->module,(char *)0x0,
                                (char **)(str + 0x10));
      if (LVar2 != LY_SUCCESS) {
        return LY_EVALID;
      }
    }
    _ret___3 = (lysp_import *)_ret___3->ref;
  } while( true );
}

Assistant:

static LY_ERR
lysp_stmt_import(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_import **imports)
{
    struct lysp_import *imp;
    const char *str = NULL;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *imports, imp, LY_EMEM);

    /* store name */
    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &imp->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_PREFIX:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &imp->prefix, Y_IDENTIF_ARG, &imp->exts));
            LY_CHECK_RET(lysp_check_prefix(ctx, *imports, NULL, &imp->prefix), LY_EVALID);
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &imp->dsc, Y_STR_ARG, &imp->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &imp->ref, Y_STR_ARG, &imp->exts));
            break;
        case LY_STMT_REVISION_DATE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, stmt, 0, &str, Y_STR_ARG, &imp->exts));
            strcpy(imp->rev, str);
            lydict_remove(PARSER_CTX(ctx), str);
            LY_CHECK_RET(lysp_check_date(ctx, imp->rev, LY_REV_SIZE - 1, "revision-date"));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &imp->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(LY_STMT_IMPORT));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}